

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.c
# Opt level: O3

piga_status piga_client_free(piga_client *client)

{
  void *__shmaddr;
  int iVar1;
  undefined4 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  
  __shmaddr = (client->shared_memory).start;
  if ((__shmaddr != (void *)0x0) && (iVar1 = shmdt(__shmaddr), iVar1 == -1)) {
    return PIGA_ERROR_COULD_NOT_DETACH_SHARED_MEMORY;
  }
  piga_shared_memory_free_players(&client->shared_memory);
  uVar3 = piga_event_create();
  piga_event_set_type(uVar3,0x200);
  uVar4 = piga_event_get_consumer_unregistered(uVar3);
  uVar2 = piga_event_queue_get_default_process_shm_key();
  piga_event_consumer_unregistered_set_shm_key(uVar4,uVar2);
  piga_event_queue_push(client->out_queue,uVar3);
  piga_event_free(uVar3);
  if (client->out_queue != (piga_event_queue *)0x0) {
    piga_event_queue_disconnect_from_shm();
    client->out_queue = (piga_event_queue *)0x0;
    client->out_queue_shm_id = 0;
  }
  if (client->in_queue != (piga_event_queue *)0x0) {
    piga_event_queue_free_in_shm(client->in_queue,client->in_queue_shm_id);
    client->in_queue = (piga_event_queue *)0x0;
    client->in_queue_shm_id = 0;
  }
  if (client->config != (piga_client_config *)0x0) {
    free(client->config);
  }
  free(client);
  return PIGA_STATUS_OK;
}

Assistant:

piga_status piga_client_free(piga_client* client)
{
    // Check if the shared memory can be detached.
    // If it cannot be detached without errors, the destructor will stop and delete nothing.
    if(client->shared_memory.start != NULL) {
        if(shmdt(client->shared_memory.start) == -1)
            return PIGA_ERROR_COULD_NOT_DETACH_SHARED_MEMORY;
    }
    
    piga_shared_memory_free_players(&client->shared_memory);
    
    // Unregister this consumer.
    piga_event *ev = piga_event_create();
    piga_event_set_type(ev, PIGA_EVENT_CONSUMER_UNREGISTERED);
    piga_event_consumer_unregistered *unregistered = piga_event_get_consumer_unregistered(ev);
    piga_event_consumer_unregistered_set_shm_key(unregistered, piga_event_queue_get_default_process_shm_key());
    piga_event_queue_push(client->out_queue, ev);
    piga_event_free(ev);
    
    if(client->out_queue) {
        piga_event_queue_disconnect_from_shm(client->out_queue);
        client->out_queue = 0;
        client->out_queue_shm_id = 0;
    }
    if(client->in_queue) {
        piga_event_queue_free_in_shm(client->in_queue, client->in_queue_shm_id);
        client->in_queue = 0;
        client->in_queue_shm_id = 0;
    }
        
    if(client->config != NULL)
        free(client->config);
    
    free(client);
    
    return PIGA_STATUS_OK;
}